

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O1

void cross_validation(problem *prob,parameter *param,int nr_fold,double *target)

{
  uint uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  void *__ptr;
  void *__ptr_00;
  ulong uVar5;
  long lVar6;
  model *model_;
  long lVar7;
  int iVar8;
  model *model_ptr;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  double dVar13;
  problem subprob;
  problem local_78;
  ulong local_58;
  ulong local_50;
  long local_48;
  parameter *local_40;
  ulong local_38;
  
  uVar9 = (ulong)(uint)nr_fold;
  uVar1 = prob->l;
  uVar11 = (ulong)uVar1;
  lVar12 = (long)(int)uVar1;
  local_40 = param;
  __ptr = malloc(lVar12 * 4);
  local_48 = lVar12;
  if ((int)uVar1 < nr_fold) {
    cross_validation_cold_1();
    uVar9 = (ulong)uVar1;
  }
  iVar8 = (int)uVar9;
  __ptr_00 = malloc((long)iVar8 * 4 + 4);
  if (0 < (int)uVar1) {
    uVar5 = 0;
    do {
      *(int *)((long)__ptr + uVar5 * 4) = (int)uVar5;
      uVar5 = uVar5 + 1;
    } while (uVar11 != uVar5);
  }
  if (0 < (int)uVar1) {
    lVar12 = 0;
    uVar5 = uVar11;
    do {
      iVar4 = rand();
      lVar6 = iVar4 % (int)uVar5 + lVar12;
      uVar2 = *(undefined4 *)((long)__ptr + lVar12 * 4);
      *(undefined4 *)((long)__ptr + lVar12 * 4) = *(undefined4 *)((long)__ptr + lVar6 * 4);
      *(undefined4 *)((long)__ptr + lVar6 * 4) = uVar2;
      lVar12 = lVar12 + 1;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  if (-1 < iVar8) {
    iVar4 = 0;
    uVar5 = 0;
    do {
      *(int *)((long)__ptr_00 + uVar5 * 4) = iVar4 / iVar8;
      uVar5 = uVar5 + 1;
      iVar4 = iVar4 + uVar1;
    } while (iVar8 + 1 != uVar5);
  }
  if (0 < iVar8) {
    uVar5 = 0;
    local_58 = uVar9;
    local_50 = uVar11;
    do {
      iVar8 = *(int *)((long)__ptr_00 + uVar5 * 4);
      lVar7 = (long)iVar8;
      iVar4 = *(int *)((long)__ptr_00 + uVar5 * 4 + 4);
      lVar6 = (long)iVar4;
      local_78.bias = prob->bias;
      local_78.n = prob->n;
      iVar10 = (int)local_50;
      local_78.l = (iVar8 - iVar4) + iVar10;
      lVar12 = (long)local_78.l;
      local_38 = uVar5;
      local_78.x = (feature_node **)malloc(lVar12 << 3);
      local_78.y = (double *)malloc(lVar12 << 3);
      lVar12 = 0;
      if (0 < lVar7) {
        do {
          iVar3 = *(int *)((long)__ptr + lVar12 * 4);
          local_78.x[lVar12] = prob->x[iVar3];
          local_78.y[lVar12] = prob->y[iVar3];
          lVar12 = lVar12 + 1;
        } while (lVar7 != lVar12);
      }
      if (iVar4 < iVar10) {
        do {
          iVar10 = *(int *)((long)__ptr + lVar6 * 4);
          local_78.x[lVar12] = prob->x[iVar10];
          local_78.y[lVar12] = prob->y[iVar10];
          lVar12 = lVar12 + 1;
          lVar6 = lVar6 + 1;
        } while (local_48 != lVar6);
      }
      model_ = train(&local_78,local_40);
      if (iVar8 < iVar4) {
        lVar12 = 0;
        do {
          iVar10 = *(int *)((long)__ptr + lVar12 * 4 + lVar7 * 4);
          dVar13 = predict(model_,prob->x[iVar10]);
          target[iVar10] = dVar13;
          lVar12 = lVar12 + 1;
        } while (iVar4 - iVar8 != (int)lVar12);
      }
      if (model_ != (model *)0x0) {
        free_model_content(model_);
        free(model_);
      }
      uVar5 = local_38 + 1;
      free(local_78.x);
      free(local_78.y);
    } while (uVar5 != local_58);
  }
  free(__ptr_00);
  free(__ptr);
  return;
}

Assistant:

void cross_validation(const problem *prob, const parameter *param, int nr_fold, double *target)
{
	int i;
	int *fold_start;
	int l = prob->l;
	int *perm = Malloc(int,l);
	if (nr_fold > l)
	{
		nr_fold = l;
		fprintf(stderr,"WARNING: # folds > # data. Will use # folds = # data instead (i.e., leave-one-out cross validation)\n");
	}
	fold_start = Malloc(int,nr_fold+1);
	for(i=0;i<l;i++) perm[i]=i;
	for(i=0;i<l;i++)
	{
		int j = i+rand()%(l-i);
		swap(perm[i],perm[j]);
	}
	for(i=0;i<=nr_fold;i++)
		fold_start[i]=i*l/nr_fold;

#ifdef CV_OMP
#pragma omp parallel for private(i) schedule(dynamic)
#endif
	for(i=0;i<nr_fold;i++)
	{
		int begin = fold_start[i];
		int end = fold_start[i+1];
		int j,k;
		struct problem subprob;

		subprob.bias = prob->bias;
		subprob.n = prob->n;
		subprob.l = l-(end-begin);
		subprob.x = Malloc(struct feature_node*,subprob.l);
		subprob.y = Malloc(double,subprob.l);

		k=0;
		for(j=0;j<begin;j++)
		{
			subprob.x[k] = prob->x[perm[j]];
			subprob.y[k] = prob->y[perm[j]];
			++k;
		}
		for(j=end;j<l;j++)
		{
			subprob.x[k] = prob->x[perm[j]];
			subprob.y[k] = prob->y[perm[j]];
			++k;
		}
		struct model *submodel = train(&subprob,param);
		for(j=begin;j<end;j++)
			target[perm[j]] = predict(submodel,prob->x[perm[j]]);
		free_and_destroy_model(&submodel);
		free(subprob.x);
		free(subprob.y);
	}
	free(fold_start);
	free(perm);
}